

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O1

void __thiscall
google::protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::
AddAnnotationNew(AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this,Annotation *a)

{
  uint uVar1;
  MessageLite *this_00;
  string_view data;
  
  this_00 = (MessageLite *)
            internal::RepeatedPtrFieldBase::AddMessageLite
                      ((RepeatedPtrFieldBase *)&(this->annotation_proto_->field_0)._impl_,
                       Arena::DefaultConstruct<google::protobuf::GeneratedCodeInfo_Annotation>);
  data._M_str = (a->second)._M_dataplus._M_p;
  data._M_len = (a->second)._M_string_length;
  MessageLite::ParseFromString(this_00,data);
  *(int *)&this_00[3]._internal_metadata_.ptr_ = (int)(a->first).first;
  uVar1 = *(uint *)&this_00[1]._vptr_MessageLite;
  *(uint *)&this_00[1]._vptr_MessageLite = uVar1 | 2;
  *(int *)((long)&this_00[3]._internal_metadata_.ptr_ + 4) = (int)(a->first).second;
  *(uint *)&this_00[1]._vptr_MessageLite = uVar1 | 6;
  return;
}

Assistant:

void AddAnnotationNew(Annotation& a) override {
    auto* annotation = annotation_proto_->add_annotation();
    annotation->ParseFromString(a.second);
    annotation->set_begin(a.first.first);
    annotation->set_end(a.first.second);
  }